

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test9(void)

{
  ostream *poVar1;
  int iVar2;
  int *x;
  int *piVar3;
  vector<int,_std::allocator<int>_> v;
  Queue q;
  _Vector_base<int,_std::allocator<int>_> local_60;
  queue<int> local_48;
  
  CP::queue<int>::queue(&local_48);
  for (iVar2 = 0; iVar2 != 350000; iVar2 = iVar2 + 7) {
    local_60._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar2;
    CP::queue<int>::push(&local_48,(int *)&local_60);
  }
  CP::queue<int>::to_vector((vector<int,_std::allocator<int>_> *)&local_60,&local_48,0x2904);
  for (piVar3 = (int *)CONCAT44(local_60._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)local_60._M_impl.super__Vector_impl_data._M_start);
      piVar3 != local_60._M_impl.super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar3);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
  CP::queue<int>::~queue(&local_48);
  return true;
}

Assistant:

bool test9() {
  Queue q;
  for (int i = 0;i < 50000;i++)
    q.push(i*7);
  vector<int> v = q.to_vector(10500);
  for (auto &x : v) {
    cout << x << " ";
  }
  cout << endl;
  return true;
}